

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

cl_int __thiscall
CLIntercept::allocateAndGetKernelInfoString
          (CLIntercept *this,cl_kernel kernel,cl_kernel_info param_name,char **param_value)

{
  size_t sVar1;
  cl_int cVar2;
  char *pcVar3;
  size_t size;
  size_t local_38;
  
  local_38 = 0;
  if (*param_value != (char *)0x0) {
    operator_delete__(*param_value);
    *param_value = (char *)0x0;
  }
  cVar2 = (*(this->m_Dispatch).clGetKernelInfo)(kernel,param_name,0,(void *)0x0,&local_38);
  sVar1 = local_38;
  if (local_38 == 0 || cVar2 != 0) {
    if (cVar2 != 0) goto LAB_0015c8e1;
    pcVar3 = *param_value;
  }
  else {
    pcVar3 = (char *)operator_new__(local_38);
    *param_value = pcVar3;
  }
  cVar2 = (*(this->m_Dispatch).clGetKernelInfo)(kernel,param_name,sVar1,pcVar3,(size_t *)0x0);
  if (cVar2 == 0) {
    return 0;
  }
LAB_0015c8e1:
  if (*param_value != (char *)0x0) {
    operator_delete__(*param_value);
  }
  *param_value = (char *)0x0;
  return cVar2;
}

Assistant:

cl_int CLIntercept::allocateAndGetKernelInfoString(
    cl_kernel kernel,
    cl_kernel_info param_name,
    char*& param_value ) const
{
    cl_int  errorCode = CL_SUCCESS;
    size_t  size = 0;

    if( errorCode == CL_SUCCESS )
    {
        if( param_value != NULL )
        {
            CLI_ASSERT( 0 );
            delete [] param_value;
            param_value = NULL;
        }
    }

    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetKernelInfo(
            kernel,
            param_name,
            0,
            NULL,
            &size );
    }

    if( errorCode == CL_SUCCESS )
    {
        if( size != 0 )
        {
            param_value = new char[ size ];
            if( param_value == NULL )
            {
                errorCode = CL_OUT_OF_HOST_MEMORY;
            }
        }
    }

    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetKernelInfo(
            kernel,
            param_name,
            size,
            param_value,
            NULL );
    }

    if( errorCode != CL_SUCCESS )
    {
        delete [] param_value;
        param_value = NULL;
    }

    return errorCode;
}